

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitAssignmentExpression(SyntaxDumper *this,AssignmentExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_50;
  AssignmentExpressionSyntax *local_18;
  AssignmentExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (AssignmentExpressionSyntax *)this;
  pEVar1 = AssignmentExpressionSyntax::left(node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  AssignmentExpressionSyntax::operatorToken(&local_50,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pEVar1 = AssignmentExpressionSyntax::right(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  return Skip;
}

Assistant:

virtual Action visitAssignmentExpression(const AssignmentExpressionSyntax* node) override
    {
        nonterminal(node->left());
        terminal(node->operatorToken(), node);
        nonterminal(node->right());
        return Action::Skip;
    }